

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::AddLogSink(LogSink *destination)

{
  bool bVar1;
  pointer this;
  unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
  local_20;
  lock_guard<std::shared_mutex> local_18;
  SinkLock l;
  LogSink *destination_local;
  
  l._M_device = (mutex_type *)destination;
  std::lock_guard<std::shared_mutex>::lock_guard(&local_18,(mutex_type *)sink_mutex_);
  bVar1 = std::operator==((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                           *)&sinks_,(nullptr_t)0x0);
  if (bVar1) {
    std::make_unique<std::vector<google::LogSink*,std::allocator<google::LogSink*>>>();
    std::
    unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
    ::operator=((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                 *)&sinks_,&local_20);
    std::
    unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
    ::~unique_ptr(&local_20);
  }
  this = std::
         unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
         ::operator->((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                       *)&sinks_);
  std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::push_back
            (this,(value_type *)&l);
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

inline void LogDestination::AddLogSink(LogSink* destination) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  SinkLock l{sink_mutex_};
  if (sinks_ == nullptr) sinks_ = std::make_unique<std::vector<LogSink*>>();
  sinks_->push_back(destination);
}